

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkcookie.cpp
# Opt level: O1

bool checkStaticArray(int *val,QByteArrayView dateString,int at,char *array,int size)

{
  char *__s;
  bool bVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  storage_type *psVar5;
  int j;
  int iVar6;
  
  psVar5 = dateString.m_data;
  if (((0xe5 < (byte)(psVar5[at] + 0x85U)) && (*val == -1)) && ((long)(at + 3) <= dateString.m_size)
     ) {
    iVar6 = 0;
    iVar3 = 0;
    do {
      iVar2 = iVar3;
      if (size < iVar2) {
        return false;
      }
      __s = array + iVar2;
      if (((array[iVar2] == psVar5[at]) && (__s[1] == psVar5[(long)at + 1])) &&
         (__s[2] == psVar5[(long)at + 2])) {
        *val = iVar6;
        bVar1 = false;
        iVar3 = iVar2;
      }
      else {
        sVar4 = strlen(__s);
        iVar3 = (int)sVar4 + iVar2 + 1;
        iVar6 = iVar6 + 1;
        bVar1 = true;
      }
    } while (bVar1);
    if (iVar2 <= size) {
      return true;
    }
  }
  return false;
}

Assistant:

static bool checkStaticArray(int &val, QByteArrayView dateString, int at, const char *array, int size)
{
    if (dateString[at] < 'a' || dateString[at] > 'z')
        return false;
    if (val == -1 && dateString.size() >= at + 3) {
        int j = 0;
        int i = 0;
        while (i <= size) {
            const char *str = array + i;
            if (str[0] == dateString[at]
                && str[1] == dateString[at + 1]
                && str[2] == dateString[at + 2]) {
                val = j;
                return true;
            }
            i += int(strlen(str)) + 1;
            ++j;
        }
    }
    return false;
}